

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

opj_tgt_tree_t * tgt_create(int numleafsh,int numleafsv)

{
  ulong uVar1;
  ulong uVar2;
  opj_tgt_node *poVar3;
  opj_tgt_tree_t *p_tree;
  opj_tgt_node_t *poVar4;
  ulong uVar5;
  long lVar6;
  opj_tgt_node *poVar7;
  opj_tgt_node *poVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int nplv [32];
  int nplh [32];
  
  uVar1 = (ulong)(uint)numleafsh;
  p_tree = (opj_tgt_tree_t *)malloc(0x20);
  uVar9 = 0;
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    p_tree->numleafsh = numleafsh;
    p_tree->numleafsv = numleafsv;
    lVar14 = -1;
    uVar5 = (ulong)(uint)numleafsv;
    nplh[0] = numleafsh;
    do {
      iVar11 = (int)uVar5 * (int)uVar1;
      uVar1 = (long)((int)uVar1 + 1) / 2;
      nplh[lVar14 + 2] = (int)uVar1;
      uVar2 = (long)((int)uVar5 + 1) / 2;
      uVar5 = uVar2 & 0xffffffff;
      nplv[lVar14 + 2] = (int)uVar2;
      uVar9 = uVar9 + iVar11;
      lVar14 = lVar14 + 1;
    } while (1 < iVar11);
    p_tree->numnodes = uVar9;
    nplv[0] = numleafsv;
    if (uVar9 != 0) {
      poVar4 = (opj_tgt_node_t *)calloc((ulong)uVar9,0x18);
      p_tree->nodes = poVar4;
      if (poVar4 != (opj_tgt_node_t *)0x0) {
        poVar7 = poVar4 + (uint)(numleafsv * numleafsh);
        poVar8 = poVar7;
        for (lVar6 = 0; lVar14 != lVar6; lVar6 = lVar6 + 1) {
          uVar9 = nplv[lVar6];
          uVar12 = 0;
          uVar10 = uVar9;
          if ((int)uVar9 < 1) {
            uVar10 = uVar12;
          }
          for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
            iVar11 = nplh[lVar6];
            lVar13 = (long)iVar11;
            for (; 0 < iVar11; iVar11 = iVar11 + -2) {
              poVar4->parent = poVar7;
              if (iVar11 == 1) {
                poVar4 = poVar4 + 1;
              }
              else {
                poVar4[1].parent = poVar7;
                poVar4 = poVar4 + 2;
              }
              poVar7 = poVar7 + 1;
            }
            poVar3 = poVar8 + lVar13;
            if (uVar12 == uVar9 - 1 || (uVar12 & 1) != 0) {
              poVar3 = poVar7;
              poVar8 = poVar7;
            }
            poVar7 = poVar8;
            poVar8 = poVar3;
          }
        }
        poVar4->parent = (opj_tgt_node *)0x0;
        tgt_reset(p_tree);
        return p_tree;
      }
    }
    free(p_tree);
  }
  return (opj_tgt_tree_t *)0x0;
}

Assistant:

opj_tgt_tree_t *tgt_create(int numleafsh, int numleafsv) {
	int nplh[32];
	int nplv[32];
	opj_tgt_node_t *node = NULL;
	opj_tgt_node_t *parentnode = NULL;
	opj_tgt_node_t *parentnode0 = NULL;
	opj_tgt_tree_t *tree = NULL;
	int i, j, k;
	int numlvls;
	int n;

	tree = (opj_tgt_tree_t *) opj_malloc(sizeof(opj_tgt_tree_t));
	if(!tree) return NULL;
	tree->numleafsh = numleafsh;
	tree->numleafsv = numleafsv;

	numlvls = 0;
	nplh[0] = numleafsh;
	nplv[0] = numleafsv;
	tree->numnodes = 0;
	do {
		n = nplh[numlvls] * nplv[numlvls];
		nplh[numlvls + 1] = (nplh[numlvls] + 1) / 2;
		nplv[numlvls + 1] = (nplv[numlvls] + 1) / 2;
		tree->numnodes += n;
		++numlvls;
	} while (n > 1);
	
	/* ADD */
	if (tree->numnodes == 0) {
		opj_free(tree);
		return NULL;
	}

	tree->nodes = (opj_tgt_node_t*) opj_calloc(tree->numnodes, sizeof(opj_tgt_node_t));
	if(!tree->nodes) {
		opj_free(tree);
		return NULL;
	}

	node = tree->nodes;
	parentnode = &tree->nodes[tree->numleafsh * tree->numleafsv];
	parentnode0 = parentnode;
	
	for (i = 0; i < numlvls - 1; ++i) {
		for (j = 0; j < nplv[i]; ++j) {
			k = nplh[i];
			while (--k >= 0) {
				node->parent = parentnode;
				++node;
				if (--k >= 0) {
					node->parent = parentnode;
					++node;
				}
				++parentnode;
			}
			if ((j & 1) || j == nplv[i] - 1) {
				parentnode0 = parentnode;
			} else {
				parentnode = parentnode0;
				parentnode0 += nplh[i];
			}
		}
	}
	node->parent = 0;
	
	tgt_reset(tree);
	
	return tree;
}